

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.h
# Opt level: O2

void __thiscall
cursespp::ShortcutsWindow::Entry::Entry(Entry *this,string *key,string *desc,int64_t attrs)

{
  (this->position).offset = 0;
  (this->position).width = 0;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->key);
  std::__cxx11::string::_M_assign((string *)&this->description);
  this->attrs = attrs;
  return;
}

Assistant:

Entry(const std::string& key, const std::string& desc, int64_t attrs = -1) {
                    this->key = key;
                    this->description = desc;
                    this->attrs = attrs;
                }